

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O1

char * lua_setupvalue(lua_State *L,int funcindex,int n)

{
  StkId pTVar1;
  GCObject *v;
  TValue *fi;
  char *pcVar2;
  GCObject *owner;
  TValue *val;
  GCObject *local_30;
  TValue *local_28;
  
  local_28 = (TValue *)0x0;
  local_30 = (GCObject *)0x0;
  fi = index2addr(L,funcindex);
  pcVar2 = aux_upvalue(fi,n,&local_28,&local_30);
  if (pcVar2 != (char *)0x0) {
    pTVar1 = L->top;
    L->top = pTVar1 + -1;
    local_28->value_ = pTVar1[-1].value_;
    local_28->tt_ = pTVar1[-1].tt_;
    if ((((L->top->tt_ & 0x40) != 0) && (v = (L->top->value_).gc, ((v->gch).marked & 3) != 0)) &&
       (((local_30->gch).marked & 4) != 0)) {
      luaC_barrier_(L,local_30,v);
    }
  }
  return pcVar2;
}

Assistant:

LUA_API const char *lua_setupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  GCObject *owner = NULL;  /* to avoid warnings */
  StkId fi;
  lua_lock(L);
  fi = index2addr(L, funcindex);
  api_checknelems(L, 1);
  name = aux_upvalue(fi, n, &val, &owner);
  if (name) {
    L->top--;
    setobj(L, val, L->top);
    luaC_barrier(L, owner, L->top);
  }
  lua_unlock(L);
  return name;
}